

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d7297f::PathSimplifier::initElements
          (PathSimplifier *this,QVectorPath *path,QTransform *matrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  qsizetype qVar18;
  Element *pEVar19;
  long lVar20;
  Element **ppEVar21;
  QVectorPath *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar22;
  int i_3;
  QPoint *from_3;
  QPoint *to_5;
  int i_2;
  quint32 prev;
  int i_1;
  QPoint *to_3;
  QPoint *from_2;
  qreal y2;
  qreal x2;
  qreal y1;
  qreal x1;
  quint32 startPointIndex;
  QPoint *from_1;
  QPoint *to_1;
  QPoint *from;
  int i;
  quint32 previousIndex;
  quint32 moveToIndex;
  qreal *p;
  ElementType *e;
  int pathElementCount;
  Element *element_4;
  QPoint to_4;
  qreal y_1;
  qreal x_1;
  Element *element_3;
  QPoint ctrl2;
  QPoint ctrl1;
  QPoint ctrl;
  Element *element_2;
  QPoint end;
  Element *element_1;
  QPoint to_2;
  QPoint to;
  Element *element;
  qreal y;
  qreal x;
  QPoint *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  QTransform *in_stack_fffffffffffffe40;
  bool local_1ad;
  quint32 in_stack_fffffffffffffe6c;
  quint32 in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  quint32 in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  ElementType EVar23;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  PathSimplifier *in_stack_fffffffffffffeb8;
  quint32 local_134;
  uint local_130;
  int local_12c;
  int local_d4;
  uint local_d0;
  uint local_cc;
  double *local_c8;
  ElementType *local_c0;
  double local_58;
  double local_50;
  Element *local_48;
  undefined1 *local_40;
  Element *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  Element *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = QVectorPath::hints(in_RSI);
  *(uint *)(in_RDI + 0x58) = uVar13;
  iVar14 = QVectorPath::elementCount(in_RSI);
  if (iVar14 != 0) {
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reserve
              ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (qsizetype)in_stack_fffffffffffffe28);
    ElementAllocator::allocate
              ((ElementAllocator *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    QDataBuffer<QPoint>::reserve
              ((QDataBuffer<QPoint> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (qsizetype)in_stack_fffffffffffffe28);
    local_c0 = QVectorPath::elements(in_RSI);
    local_c8 = QVectorPath::points(in_RSI);
    if (local_c0 == (ElementType *)0x0) {
      for (local_12c = 0; local_12c < iVar14; local_12c = local_12c + 1) {
        QTransform::map(in_stack_fffffffffffffe40,
                        (qreal)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        (qreal)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        (qreal *)in_stack_fffffffffffffe28,(qreal *)0x5e6335);
        qRound(3.05620016522641e-317);
        qRound(3.0562130109332e-317);
        QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                       (int)in_stack_fffffffffffffe28);
        QDataBuffer<QPoint>::last(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
        bVar12 = ::operator!=((QPoint *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe28);
        if (bVar12) {
          QDataBuffer<QPoint>::add
                    ((QDataBuffer<QPoint> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28);
        }
      }
      while( true ) {
        bVar12 = QDataBuffer<QPoint>::isEmpty(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
        local_1ad = false;
        if (!bVar12) {
          QDataBuffer<QPoint>::last(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
          QDataBuffer<QPoint>::first(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
          local_1ad = ::operator==((QPoint *)
                                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                   in_stack_fffffffffffffe28);
        }
        if (local_1ad == false) break;
        QDataBuffer<QPoint>::pop_back(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
      }
      bVar12 = QDataBuffer<QPoint>::isEmpty(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
      if (bVar12) goto LAB_005e66ca;
      qVar18 = QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
      local_130 = (int)qVar18 - 1;
      local_134 = 0;
      while( true ) {
        lVar20 = (long)(int)local_134;
        qVar18 = QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
        if (qVar18 <= lVar20) break;
        QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(long)(int)local_134);
        QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)local_130);
        pEVar19 = ElementAllocator::newElement
                            ((ElementAllocator *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        *(ushort *)&pEVar19->field_0x38 = *(ushort *)&pEVar19->field_0x38 & 0xff00 | 1;
        pEVar19->indices[0] = local_130;
        pEVar19->indices[1] = local_134;
        iVar14 = QPoint::x((QPoint *)0x5e65a6);
        iVar15 = QPoint::x((QPoint *)0x5e65b7);
        iVar15 = iVar14 + iVar15 >> 1;
        piVar17 = QPoint::rx((QPoint *)0x5e65d2);
        *piVar17 = iVar15;
        in_stack_fffffffffffffe38 = QPoint::y((QPoint *)0x5e65e5);
        iVar16 = QPoint::y((QPoint *)0x5e65f6);
        in_stack_fffffffffffffe3c = in_stack_fffffffffffffe38 + iVar16 >> 1;
        piVar17 = QPoint::ry((QPoint *)0x5e6611);
        *piVar17 = in_stack_fffffffffffffe3c;
        QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                  ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                   CONCAT44(iVar15,iVar14),(Element **)in_stack_fffffffffffffe28);
        local_130 = local_134;
        local_134 = local_134 + 1;
      }
    }
    else {
      local_10 = 0xffffffffffffffff;
      local_18 = 0xffffffffffffffff;
      local_cc = 0;
      local_d0 = 0;
      for (local_d4 = 0; local_d4 < iVar14; local_d4 = local_d4 + 1) {
        EVar23 = *local_c0;
        if (EVar23 == MoveToElement) {
          bVar12 = QDataBuffer<QPoint>::isEmpty(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
          if (!bVar12) {
            QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)local_d0);
            QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)local_cc);
            bVar12 = ::operator!=((QPoint *)
                                  CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                  in_stack_fffffffffffffe28);
            if (bVar12) {
              local_20 = ElementAllocator::newElement
                                   ((ElementAllocator *)
                                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
              *(ushort *)&local_20->field_0x38 = *(ushort *)&local_20->field_0x38 & 0xff00 | 1;
              local_20->indices[0] = local_d0;
              local_20->indices[1] = local_cc;
              in_stack_fffffffffffffe94 = QPoint::x((QPoint *)0x5e58e3);
              iVar15 = QPoint::x((QPoint *)0x5e58f4);
              in_stack_fffffffffffffe98 = (int)(in_stack_fffffffffffffe94 + iVar15) >> 1;
              piVar17 = QPoint::rx((QPoint *)0x5e590f);
              *piVar17 = in_stack_fffffffffffffe98;
              in_stack_fffffffffffffe9c = QPoint::y((QPoint *)0x5e5922);
              iVar15 = QPoint::y((QPoint *)0x5e5933);
              in_stack_fffffffffffffea0 = in_stack_fffffffffffffe9c + iVar15 >> 1;
              piVar17 = QPoint::ry((QPoint *)0x5e594e);
              *piVar17 = in_stack_fffffffffffffea0;
              QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                        ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (Element **)in_stack_fffffffffffffe28);
            }
          }
          qVar18 = QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
          local_d0 = (uint)qVar18;
          QTransform::map(in_stack_fffffffffffffe40,
                          (qreal)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          (qreal)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          (qreal *)in_stack_fffffffffffffe28,(qreal *)0x5e59c4);
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          qRound(3.05500600856041e-317);
          qRound(3.0550188542672e-317);
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                         (int)in_stack_fffffffffffffe28);
          QDataBuffer<QPoint>::add
                    ((QDataBuffer<QPoint> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28);
          local_cc = local_d0;
        }
        else if (EVar23 == LineToElement) {
          QTransform::map(in_stack_fffffffffffffe40,
                          (qreal)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          (qreal)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          (qreal *)in_stack_fffffffffffffe28,(qreal *)0x5e5a6a);
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffe8c = qRound(3.05508802345762e-317);
          qRound(3.05510086916441e-317);
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                         (int)in_stack_fffffffffffffe28);
          QDataBuffer<QPoint>::last(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
          bVar12 = ::operator!=((QPoint *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                in_stack_fffffffffffffe28);
          if (bVar12) {
            local_38 = ElementAllocator::newElement
                                 ((ElementAllocator *)
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            *(ushort *)&local_38->field_0x38 = *(ushort *)&local_38->field_0x38 & 0xff00 | 1;
            local_38->indices[0] = local_d0;
            qVar18 = QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
            local_38->indices[1] = (quint32)qVar18;
            in_stack_fffffffffffffe7c = QPoint::x((QPoint *)0x5e5b73);
            iVar15 = QPoint::x((QPoint *)0x5e5b84);
            in_stack_fffffffffffffe80 = (int)(in_stack_fffffffffffffe7c + iVar15) >> 1;
            piVar17 = QPoint::rx((QPoint *)0x5e5b9f);
            *piVar17 = in_stack_fffffffffffffe80;
            in_stack_fffffffffffffe84 = QPoint::y((QPoint *)0x5e5bb2);
            iVar15 = QPoint::y((QPoint *)0x5e5bc3);
            in_stack_fffffffffffffe88 = in_stack_fffffffffffffe84 + iVar15 >> 1;
            piVar17 = QPoint::ry((QPoint *)0x5e5bde);
            *piVar17 = in_stack_fffffffffffffe88;
            QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                      ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (Element **)in_stack_fffffffffffffe28);
            qVar18 = QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
            local_d0 = (uint)qVar18;
            QDataBuffer<QPoint>::add
                      ((QDataBuffer<QPoint> *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe28);
          }
        }
        else if (EVar23 == CurveToElement) {
          QTransform::map(in_stack_fffffffffffffe40,
                          (qreal)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          (qreal)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          (qreal *)in_stack_fffffffffffffe28,(qreal *)0x5e5c7b);
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          iVar15 = qRound(3.05534938418427e-317);
          qRound(3.05536222989106e-317);
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                         (int)in_stack_fffffffffffffe28);
          qVar18 = QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
          local_d0 = (uint)qVar18;
          QDataBuffer<QPoint>::add
                    ((QDataBuffer<QPoint> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28);
          dVar22 = local_c8[-2];
          dVar1 = *local_c8;
          dVar2 = local_c8[-2];
          dVar3 = local_c8[-1];
          dVar4 = local_c8[1];
          dVar5 = local_c8[-1];
          dVar6 = local_c8[4];
          dVar7 = local_c8[2];
          dVar8 = local_c8[4];
          dVar9 = local_c8[5];
          dVar10 = local_c8[3];
          dVar11 = local_c8[5];
          local_48 = ElementAllocator::newElement
                               ((ElementAllocator *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          local_50 = ((dVar1 - dVar2) * 1.5 + dVar22) - ((dVar7 - dVar8) * 1.5 + dVar6);
          dVar22 = qAbs<double>(&local_50);
          bVar12 = false;
          if (dVar22 < 0.001) {
            local_58 = ((dVar4 - dVar5) * 1.5 + dVar3) - ((dVar10 - dVar11) * 1.5 + dVar9);
            dVar22 = qAbs<double>(&local_58);
            bVar12 = dVar22 < 0.001;
          }
          if (bVar12) {
            QTransform::map(in_stack_fffffffffffffe40,
                            (qreal)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            (qreal)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            (qreal *)in_stack_fffffffffffffe28,(qreal *)0x5e5ece);
            iVar16 = qRound(3.05564335324354e-317);
            qRound(3.05565619895034e-317);
            QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           (int)in_stack_fffffffffffffe28);
            setElementToQuadratic
                      ((PathSimplifier *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (Element *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe7c,(QPoint *)CONCAT44(iVar15,iVar16),
                       in_stack_fffffffffffffe6c);
          }
          else {
            QTransform::map(in_stack_fffffffffffffe40,
                            (qreal)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            (qreal)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            (qreal *)in_stack_fffffffffffffe28,(qreal *)0x5e5f87);
            qRound(3.05573475538803e-317);
            qRound(3.05574760109482e-317);
            QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           (int)in_stack_fffffffffffffe28);
            QTransform::map(in_stack_fffffffffffffe40,
                            (qreal)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            (qreal)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            (qreal *)in_stack_fffffffffffffe28,(qreal *)0x5e6010);
            in_stack_fffffffffffffe6c = qRound(3.05580244238151e-317);
            qRound(3.0558152880883e-317);
            QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           (int)in_stack_fffffffffffffe28);
            setElementToCubicAndSimplify
                      (in_stack_fffffffffffffeb8,
                       (Element *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (quint32)((ulong)in_RDI >> 0x20),
                       (QPoint *)CONCAT44(EVar23,in_stack_fffffffffffffea0),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffe94);
          }
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                    ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (Element **)in_stack_fffffffffffffe28);
          local_d4 = local_d4 + 2;
          local_c0 = local_c0 + 2;
          local_c8 = local_c8 + 4;
        }
        local_c0 = local_c0 + 1;
        local_c8 = local_c8 + 2;
      }
      bVar12 = QDataBuffer<QPoint>::isEmpty(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
      if (!bVar12) {
        QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)local_d0);
        QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)local_cc);
        bVar12 = ::operator!=((QPoint *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe28);
        if (bVar12) {
          pEVar19 = ElementAllocator::newElement
                              ((ElementAllocator *)
                               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          *(ushort *)&pEVar19->field_0x38 = *(ushort *)&pEVar19->field_0x38 & 0xff00 | 1;
          pEVar19->indices[0] = local_d0;
          pEVar19->indices[1] = local_cc;
          iVar14 = QPoint::x((QPoint *)0x5e622d);
          iVar15 = QPoint::x((QPoint *)0x5e623e);
          piVar17 = QPoint::rx((QPoint *)0x5e6259);
          *piVar17 = iVar14 + iVar15 >> 1;
          iVar14 = QPoint::y((QPoint *)0x5e626c);
          iVar15 = QPoint::y((QPoint *)0x5e627d);
          piVar17 = QPoint::ry((QPoint *)0x5e6298);
          *piVar17 = iVar14 + iVar15 >> 1;
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                    ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (Element **)in_stack_fffffffffffffe28);
        }
      }
    }
    iVar14 = 0;
    while( true ) {
      lVar20 = (long)iVar14;
      qVar18 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size
                         ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                          (in_RDI + 8));
      if (qVar18 <= lVar20) break;
      ppEVar21 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::at
                           ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                            (in_RDI + 8),(long)iVar14);
      *(ushort *)&(*ppEVar21)->field_0x38 = *(ushort *)&(*ppEVar21)->field_0x38 & 0xfeff;
      iVar14 = iVar14 + 1;
    }
  }
LAB_005e66ca:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PathSimplifier::initElements(const QVectorPath &path, const QTransform &matrix)
{
    m_hints = path.hints();
    int pathElementCount = path.elementCount();
    if (pathElementCount == 0)
        return;
    m_elements.reserve(2 * pathElementCount);
    m_elementAllocator.allocate(2 * pathElementCount);
    m_points->reserve(2 * pathElementCount);
    const QPainterPath::ElementType *e = path.elements();
    const qreal *p = path.points();
    if (e) {
        qreal x, y;
        quint32 moveToIndex = 0;
        quint32 previousIndex = 0;
        for (int i = 0; i < pathElementCount; ++i, ++e, p += 2) {
            switch (*e) {
            case QPainterPath::MoveToElement:
                {
                    if (!m_points->isEmpty()) {
                        const QPoint &from = m_points->at(previousIndex);
                        const QPoint &to = m_points->at(moveToIndex);
                        if (from != to) {
                            Element *element = m_elementAllocator.newElement();
                            element->degree = Element::Line;
                            element->indices[0] = previousIndex;
                            element->indices[1] = moveToIndex;
                            element->middle.rx() = (from.x() + to.x()) >> 1;
                            element->middle.ry() = (from.y() + to.y()) >> 1;
                            m_elements.add(element);
                        }
                    }
                    previousIndex = moveToIndex = m_points->size();
                    matrix.map(p[0], p[1], &x, &y);
                    QPoint to(qRound(x * Q_FIXED_POINT_SCALE), qRound(y * Q_FIXED_POINT_SCALE));
                    m_points->add(to);
                }
                break;
            case QPainterPath::LineToElement:
                Q_ASSERT(!m_points->isEmpty());
                {
                    matrix.map(p[0], p[1], &x, &y);
                    QPoint to(qRound(x * Q_FIXED_POINT_SCALE), qRound(y * Q_FIXED_POINT_SCALE));
                    const QPoint &from = m_points->last();
                    if (to != from) {
                        Element *element = m_elementAllocator.newElement();
                        element->degree = Element::Line;
                        element->indices[0] = previousIndex;
                        element->indices[1] = quint32(m_points->size());
                        element->middle.rx() = (from.x() + to.x()) >> 1;
                        element->middle.ry() = (from.y() + to.y()) >> 1;
                        m_elements.add(element);
                        previousIndex = m_points->size();
                        m_points->add(to);
                    }
                }
                break;
            case QPainterPath::CurveToElement:
                Q_ASSERT(i + 2 < pathElementCount);
                Q_ASSERT(!m_points->isEmpty());
                Q_ASSERT(e[1] == QPainterPath::CurveToDataElement);
                Q_ASSERT(e[2] == QPainterPath::CurveToDataElement);
                {
                    quint32 startPointIndex = previousIndex;
                    matrix.map(p[4], p[5], &x, &y);
                    QPoint end(qRound(x * Q_FIXED_POINT_SCALE), qRound(y * Q_FIXED_POINT_SCALE));
                    previousIndex = m_points->size();
                    m_points->add(end);

                    // See if this cubic bezier is really quadratic.
                    qreal x1 = p[-2] + qreal(1.5) * (p[0] - p[-2]);
                    qreal y1 = p[-1] + qreal(1.5) * (p[1] - p[-1]);
                    qreal x2 = p[4] + qreal(1.5) * (p[2] - p[4]);
                    qreal y2 = p[5] + qreal(1.5) * (p[3] - p[5]);

                    Element *element = m_elementAllocator.newElement();
                    if (qAbs(x1 - x2) < qreal(1e-3) && qAbs(y1 - y2) < qreal(1e-3)) {
                        // The bezier curve is quadratic.
                        matrix.map(x1, y1, &x, &y);
                        QPoint ctrl(qRound(x * Q_FIXED_POINT_SCALE),
                                    qRound(y * Q_FIXED_POINT_SCALE));
                        setElementToQuadratic(element, startPointIndex, ctrl, previousIndex);
                    } else {
                        // The bezier curve is cubic.
                        matrix.map(p[0], p[1], &x, &y);
                        QPoint ctrl1(qRound(x * Q_FIXED_POINT_SCALE),
                                     qRound(y * Q_FIXED_POINT_SCALE));
                        matrix.map(p[2], p[3], &x, &y);
                        QPoint ctrl2(qRound(x * Q_FIXED_POINT_SCALE),
                                     qRound(y * Q_FIXED_POINT_SCALE));
                        setElementToCubicAndSimplify(element, startPointIndex, ctrl1, ctrl2,
                                                     previousIndex);
                    }
                    m_elements.add(element);
                }
                i += 2;
                e += 2;
                p += 4;

                break;
            default:
                Q_ASSERT_X(0, "QSGPathSimplifier::initialize", "Unexpected element type.");
                break;
            }
        }
        if (!m_points->isEmpty()) {
            const QPoint &from = m_points->at(previousIndex);
            const QPoint &to = m_points->at(moveToIndex);
            if (from != to) {
                Element *element = m_elementAllocator.newElement();
                element->degree = Element::Line;
                element->indices[0] = previousIndex;
                element->indices[1] = moveToIndex;
                element->middle.rx() = (from.x() + to.x()) >> 1;
                element->middle.ry() = (from.y() + to.y()) >> 1;
                m_elements.add(element);
            }
        }
    } else {
        qreal x, y;

        for (int i = 0; i < pathElementCount; ++i, p += 2) {
            matrix.map(p[0], p[1], &x, &y);
            QPoint to(qRound(x * Q_FIXED_POINT_SCALE), qRound(y * Q_FIXED_POINT_SCALE));
            if (to != m_points->last())
                m_points->add(to);
        }

        while (!m_points->isEmpty() && m_points->last() == m_points->first())
            m_points->pop_back();

        if (m_points->isEmpty())
            return;

        quint32 prev = quint32(m_points->size() - 1);
        for (int i = 0; i < m_points->size(); ++i) {
            QPoint &to = m_points->at(i);
            QPoint &from = m_points->at(prev);
            Element *element = m_elementAllocator.newElement();
            element->degree = Element::Line;
            element->indices[0] = prev;
            element->indices[1] = quint32(i);
            element->middle.rx() = (from.x() + to.x()) >> 1;
            element->middle.ry() = (from.y() + to.y()) >> 1;
            m_elements.add(element);
            prev = i;
        }
    }

    for (int i = 0; i < m_elements.size(); ++i)
        m_elements.at(i)->processed = false;
}